

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O1

void __thiscall SimpleLoggerMgr::enableOnlyOneDisplayer(SimpleLoggerMgr *this)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  bool bVar3;
  undefined4 uVar4;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_20;
  
  local_20._M_owns = false;
  local_20._M_device = &this->loggersLock;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  p_Var2 = (this->loggers)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    bVar3 = false;
    do {
      p_Var1 = p_Var2[1]._M_nxt;
      if (p_Var1 != (_Hash_node_base *)0x0) {
        uVar4 = 0xffffffff;
        if (!bVar3) {
          bVar3 = true;
          uVar4 = 4;
          if ((*(int *)((long)&p_Var1[0x48]._M_nxt + 4) < 4) &&
             ((*(byte *)((long)&(p_Var1[7]._M_nxt[-3]._M_nxt)->_M_nxt + (long)&p_Var1[0xb]._M_nxt) &
              5) == 0)) {
            LOCK();
            *(undefined4 *)((long)&p_Var1[0x48]._M_nxt + 4) = 4;
            UNLOCK();
          }
        }
        LOCK();
        *(undefined4 *)&p_Var1[0x49]._M_nxt = uVar4;
        UNLOCK();
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void SimpleLoggerMgr::enableOnlyOneDisplayer() {
    bool marked = false;
    std::unique_lock<std::mutex> l(loggersLock);
    for (auto& entry: loggers) {
        SimpleLogger* logger = entry;
        if (!logger) continue;
        if (!marked) {
            // The first logger: enable display
            if (logger->getLogLevel() < 4) {
                logger->setLogLevel(4);
            }
            logger->setDispLevel(4);
            marked = true;
        } else {
            // The others: disable display
            logger->setDispLevel(-1);
        }
    }
}